

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

char * cmSourceFileGetProperty(void *arg,char *prop)

{
  cmSourceFile *this;
  cmCPluginAPISourceFile *pcVar1;
  int iVar2;
  cmCustomCommand **this_00;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  cmSourceFile *local_30;
  cmSourceFile *rsf;
  cmCPluginAPISourceFile *sf;
  char *prop_local;
  void *arg_local;
  
  this = *arg;
  local_30 = this;
  rsf = (cmSourceFile *)arg;
  sf = (cmCPluginAPISourceFile *)prop;
  prop_local = (char *)arg;
  if (this == (cmSourceFile *)0x0) {
    iVar2 = strcmp(prop,"LOCATION");
    pcVar1 = sf;
    if (iVar2 == 0) {
      arg_local = (void *)std::__cxx11::string::c_str();
    }
    else {
      this_00 = &rsf->CustomCommand;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_88,(char *)pcVar1,&local_89);
      arg_local = cmPropertyMap::GetPropertyValue((cmPropertyMap *)this_00,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,prop,&local_51);
    arg_local = cmSourceFile::GetProperty(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  return (char *)arg_local;
}

Assistant:

const char* CCONV cmSourceFileGetProperty(void* arg, const char* prop)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if (cmSourceFile* rsf = sf->RealSourceFile) {
    return rsf->GetProperty(prop);
  }
  if (!strcmp(prop, "LOCATION")) {
    return sf->FullPath.c_str();
  }
  return sf->Properties.GetPropertyValue(prop);
}